

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(int32_t *src,float *dst,uint32_t len)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int i;
  uint32_t uVar7;
  
  if (((ulong)dst & 0xf) != 0 && len != 0) {
    lVar6 = 0;
    uVar7 = len;
    do {
      *(float *)((long)dst + lVar6) = (float)(*(int *)((long)src + lVar6) >> 8) * 1.192093e-07;
      len = uVar7 - 1;
      lVar1 = lVar6 + 4;
      if (uVar7 == 1) break;
      iVar5 = (int)lVar6;
      lVar6 = lVar1;
      uVar7 = len;
    } while ((iVar5 + (int)dst + 4 & 0xfU) != 0);
    src = (int32_t *)((long)src + lVar1);
    dst = (float *)((long)dst + lVar1);
  }
  uVar7 = len;
  if (3 < (int)len && ((ulong)src & 0xf) == 0) {
    do {
      iVar5 = src[1];
      iVar3 = src[2];
      iVar4 = src[3];
      *dst = (float)(*src >> 8) * 1.192093e-07;
      dst[1] = (float)(iVar5 >> 8) * 1.192093e-07;
      dst[2] = (float)(iVar3 >> 8) * 1.192093e-07;
      dst[3] = (float)(iVar4 >> 8) * 1.192093e-07;
      uVar7 = len - 4;
      src = src + 4;
      dst = dst + 4;
      bVar2 = 7 < len;
      len = uVar7;
    } while (bVar2);
  }
  if (uVar7 != 0) {
    lVar6 = 0;
    do {
      dst[lVar6] = (float)(src[lVar6] >> 8) * 1.192093e-07;
      lVar6 = lVar6 + 1;
    } while (uVar7 != (uint32_t)lVar6);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(
	const int32_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;

    /* Get dst aligned to 16 bytes */
    for (i = len; i && (((size_t) dst) & 15); --i, ++src, ++dst) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
    }

    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby8388607 = _mm_set1_ps(DIVBY8388607);
        const __m128i *mmsrc = (const __m128i *) src;
        while (i >= 4) {   /* 4 * sint32 */
            /* shift out lowest bits so int fits in a float32. Small precision loss, but much faster. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_srai_epi32(_mm_load_si128(mmsrc), 8)), divby8388607));
            i -= 4; mmsrc++; dst += 4;
        }
        src = (const int32_t *) mmsrc;
    }

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
        i--; src++; dst++;
    }
}